

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_dr_wav__read_chunk_header
                    (ma_dr_wav_read_proc onRead,void *pUserData,ma_dr_wav_container container,
                    ma_uint64 *pRunningBytesReadOut,ma_dr_wav_chunk_header *pHeaderOut)

{
  bool bVar1;
  ma_result mVar2;
  size_t sVar3;
  undefined1 uVar4;
  ma_uint8 sizeInBytes [4];
  ma_uint8 sizeInBytes_1 [8];
  undefined1 local_34 [2];
  undefined2 local_32;
  byte local_30;
  undefined7 local_2f;
  
  if (ma_dr_wav_container_aiff < container) {
    return MA_INVALID_FILE;
  }
  if (container == ma_dr_wav_container_w64) {
    sVar3 = (*onRead)(pUserData,pHeaderOut,0x10);
    if (sVar3 == 0x10) {
      sVar3 = (*onRead)(pUserData,&local_30,8);
      if (sVar3 != 8) goto LAB_00184e99;
      pHeaderOut->sizeInBytes = CONCAT71(local_2f,local_30) - 0x18;
      mVar2 = (uint)local_30 & ~MA_ALREADY_EXISTS;
      pHeaderOut->paddingSize = mVar2;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 0x18;
LAB_00184ed2:
      bVar1 = true;
      goto LAB_00184ed4;
    }
LAB_00184e92:
    mVar2 = MA_AT_END;
  }
  else {
    sVar3 = (*onRead)(pUserData,pHeaderOut,4);
    if (sVar3 != 4) goto LAB_00184e92;
    sVar3 = (*onRead)(pUserData,local_34,4);
    if (sVar3 == 4) {
      if ((container == ma_dr_wav_container_aiff) || (container == ma_dr_wav_container_rifx)) {
        uVar4 = local_34[0];
        _local_34 = CONCAT12(local_34[1],local_32 << 8 | local_32 >> 8);
      }
      else {
        uVar4 = local_32._1_1_;
      }
      pHeaderOut->sizeInBytes = (ulong)CONCAT13(uVar4,_local_34);
      mVar2 = (uint)_local_34 & ~MA_INVALID_ARGS;
      pHeaderOut->paddingSize = mVar2;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 8;
      goto LAB_00184ed2;
    }
LAB_00184e99:
    mVar2 = MA_INVALID_FILE;
  }
  bVar1 = false;
LAB_00184ed4:
  if (bVar1) {
    mVar2 = MA_SUCCESS;
  }
  return mVar2;
}

Assistant:

MA_PRIVATE ma_result ma_dr_wav__read_chunk_header(ma_dr_wav_read_proc onRead, void* pUserData, ma_dr_wav_container container, ma_uint64* pRunningBytesReadOut, ma_dr_wav_chunk_header* pHeaderOut)
{
    if (container == ma_dr_wav_container_riff || container == ma_dr_wav_container_rifx || container == ma_dr_wav_container_rf64 || container == ma_dr_wav_container_aiff) {
        ma_uint8 sizeInBytes[4];
        if (onRead(pUserData, pHeaderOut->id.fourcc, 4) != 4) {
            return MA_AT_END;
        }
        if (onRead(pUserData, sizeInBytes, 4) != 4) {
            return MA_INVALID_FILE;
        }
        pHeaderOut->sizeInBytes = ma_dr_wav_bytes_to_u32_ex(sizeInBytes, container);
        pHeaderOut->paddingSize = ma_dr_wav__chunk_padding_size_riff(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 8;
    } else if (container == ma_dr_wav_container_w64) {
        ma_uint8 sizeInBytes[8];
        if (onRead(pUserData, pHeaderOut->id.guid, 16) != 16) {
            return MA_AT_END;
        }
        if (onRead(pUserData, sizeInBytes, 8) != 8) {
            return MA_INVALID_FILE;
        }
        pHeaderOut->sizeInBytes = ma_dr_wav_bytes_to_u64(sizeInBytes) - 24;
        pHeaderOut->paddingSize = ma_dr_wav__chunk_padding_size_w64(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 24;
    } else {
        return MA_INVALID_FILE;
    }
    return MA_SUCCESS;
}